

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_manager.cpp
# Opt level: O3

void __thiscall
duckdb::LogManager::SetLogStorage(LogManager *this,DatabaseInstance *db,string *storage_name)

{
  string *psVar1;
  size_t __n;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pcVar2;
  int iVar3;
  LogStorage *pLVar4;
  iterator iVar5;
  mapped_type *other;
  NotImplementedException *this_01;
  InvalidInputException *this_02;
  _Alloc_hider _Var6;
  string storage_name_to_lower;
  unique_lock<std::mutex> lck;
  undefined1 local_a1;
  string local_a0;
  string local_80;
  unique_lock<std::mutex> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_60._M_device = &this->lock;
  local_60._M_owns = false;
  ::std::unique_lock<std::mutex>::lock(&local_60);
  local_60._M_owns = true;
  StringUtil::Lower(&local_80,storage_name);
  _Var6._M_p = local_80._M_dataplus._M_p;
  psVar1 = &(this->config).storage;
  __n = (this->config).storage._M_string_length;
  if (__n == local_80._M_string_length) {
    if (__n == 0) goto LAB_003bcd43;
    iVar3 = bcmp((psVar1->_M_dataplus)._M_p,local_80._M_dataplus._M_p,__n);
    if (iVar3 == 0) goto LAB_003bcd43;
  }
  pLVar4 = shared_ptr<duckdb::LogStorage,_true>::operator->(&this->log_storage);
  (*pLVar4->_vptr_LogStorage[4])(pLVar4);
  iVar3 = ::std::__cxx11::string::compare((char *)&local_80);
  if (iVar3 == 0) {
    local_a0._M_dataplus._M_p = (pointer)0x0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<duckdb::InMemoryLogStorage,std::allocator<duckdb::InMemoryLogStorage>,duckdb::DatabaseInstance&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a0._M_string_length,
               (InMemoryLogStorage **)&local_a0,(allocator<duckdb::InMemoryLogStorage> *)&local_a1,
               db);
LAB_003bccda:
    _Var6._M_p = local_a0._M_dataplus._M_p;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_a0._M_string_length + 8) =
             *(_Atomic_word *)(local_a0._M_string_length + 8) + 1;
        UNLOCK();
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_string_length ==
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_003bcd12;
      }
      else {
        *(_Atomic_word *)(local_a0._M_string_length + 8) =
             *(_Atomic_word *)(local_a0._M_string_length + 8) + 1;
      }
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_string_length);
    }
LAB_003bcd12:
    (this->log_storage).internal.super___shared_ptr<duckdb::LogStorage,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)_Var6._M_p;
    this_00 = (this->log_storage).internal.
              super___shared_ptr<duckdb::LogStorage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (this->log_storage).internal.super___shared_ptr<duckdb::LogStorage,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_string_length;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  else {
    iVar3 = ::std::__cxx11::string::compare((char *)&local_80);
    if (iVar3 == 0) {
      local_a0._M_dataplus._M_p = (pointer)0x0;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<duckdb::StdOutLogStorage,std::allocator<duckdb::StdOutLogStorage>>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a0._M_string_length,
                 (StdOutLogStorage **)&local_a0,(allocator<duckdb::StdOutLogStorage> *)&local_a1);
      goto LAB_003bccda;
    }
    iVar3 = ::std::__cxx11::string::compare((char *)&local_80);
    if (iVar3 == 0) {
      this_01 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,"File log storage is not yet implemented","");
      NotImplementedException::NotImplementedException(this_01,&local_a0);
      __cxa_throw(this_01,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    iVar5 = ::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::LogStorage,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::LogStorage,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->registered_log_storages)._M_h,&local_80);
    if (iVar5.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::LogStorage,_true>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      this_02 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,"Log storage \'%s\' is not yet registered","");
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      pcVar2 = (storage_name->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar2,pcVar2 + storage_name->_M_string_length);
      InvalidInputException::InvalidInputException<std::__cxx11::string>
                (this_02,&local_a0,&local_50);
      __cxa_throw(this_02,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    other = ::std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::LogStorage,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::LogStorage,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::LogStorage,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::LogStorage,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&this->registered_log_storages,&local_80);
    shared_ptr<duckdb::LogStorage,_true>::operator=(&this->log_storage,other);
  }
  ::std::__cxx11::string::_M_assign((string *)psVar1);
  _Var6._M_p = local_80._M_dataplus._M_p;
LAB_003bcd43:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var6._M_p != &local_80.field_2) {
    operator_delete(_Var6._M_p);
  }
  ::std::unique_lock<std::mutex>::~unique_lock(&local_60);
  return;
}

Assistant:

void LogManager::SetLogStorage(DatabaseInstance &db, const string &storage_name) {
	unique_lock<mutex> lck(lock);
	auto storage_name_to_lower = StringUtil::Lower(storage_name);

	if (config.storage == storage_name_to_lower) {
		return;
	}

	// Flush the old storage, we are going to replace it.
	log_storage->Flush();

	if (storage_name_to_lower == LogConfig::IN_MEMORY_STORAGE_NAME) {
		log_storage = make_shared_ptr<InMemoryLogStorage>(db);
	} else if (storage_name_to_lower == LogConfig::STDOUT_STORAGE_NAME) {
		log_storage = make_shared_ptr<StdOutLogStorage>();
	} else if (storage_name_to_lower == LogConfig::FILE_STORAGE_NAME) {
		throw NotImplementedException("File log storage is not yet implemented");
	} else if (registered_log_storages.find(storage_name_to_lower) != registered_log_storages.end()) {
		log_storage = registered_log_storages[storage_name_to_lower];
	} else {
		throw InvalidInputException("Log storage '%s' is not yet registered", storage_name);
	}
	config.storage = storage_name_to_lower;
}